

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void UA_NodeStore_delete(UA_NodeStore *ns)

{
  uint uVar1;
  UA_NodeStoreEntry **ppUVar2;
  UA_NodeStoreEntry *__ptr;
  ulong uVar3;
  
  uVar1 = ns->size;
  if ((ulong)uVar1 != 0) {
    ppUVar2 = ns->entries;
    uVar3 = 0;
    do {
      __ptr = ppUVar2[uVar3];
      if ((UA_NodeStoreEntry *)0x1 < __ptr) {
        UA_Node_deleteMembersAnyNodeClass(&__ptr->node);
        free(__ptr);
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  free(ns->entries);
  free(ns);
  return;
}

Assistant:

void
UA_NodeStore_delete(UA_NodeStore *ns) {
    UA_UInt32 size = ns->size;
    UA_NodeStoreEntry **entries = ns->entries;
    for(UA_UInt32 i = 0; i < size; ++i) {
        if(entries[i] > UA_NODESTORE_TOMBSTONE)
            deleteEntry(entries[i]);
    }
    UA_free(ns->entries);
    UA_free(ns);
}